

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_scriptsig_multisig_from_bytes
              (uchar *script,size_t script_len,uchar *bytes,size_t bytes_len,uint32_t *sighash,
              size_t sighash_len,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uchar *bytes_out_00;
  uchar *puVar5;
  ulong *puVar6;
  long lVar7;
  size_t sVar8;
  uchar der_buff [1095];
  size_t local_508;
  ulong local_4f8 [16];
  uchar local_478 [1096];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((bytes_len == 0 || bytes == (uchar *)0x0) || (script_len == 0 || script == (uchar *)0x0)) {
    return -2;
  }
  if (sighash == (uint32_t *)0x0) {
    return -2;
  }
  if (bytes_len < 0x40) {
    return -2;
  }
  if ((bytes_len & 0xfffffffffffffc3f) != 0) {
    return -2;
  }
  if ((bytes_out == (uchar *)0x0 || written == (size_t *)0x0) ||
      (flags != 0 || bytes_len >> 6 != sighash_len)) {
    return -2;
  }
  puVar6 = local_4f8;
  puVar5 = local_478;
  lVar7 = 0;
  sVar8 = sighash_len;
  do {
    if (0xff < *sighash) {
      iVar2 = -2;
      goto LAB_0010cd68;
    }
    iVar2 = wally_ec_sig_to_der(bytes,0x40,puVar5,0x49,puVar6);
    if (iVar2 != 0) goto LAB_0010cd68;
    sVar1 = *puVar6;
    puVar5[sVar1] = (uchar)*sighash;
    uVar3 = sVar1 + 1;
    *puVar6 = uVar3;
    lVar4 = 1;
    if ((0x4b < uVar3) && (lVar4 = 2, 0xff < uVar3)) {
      lVar4 = (ulong)(0xffff < uVar3) * 2 + 3;
    }
    lVar7 = lVar7 + uVar3 + lVar4;
    puVar6 = puVar6 + 1;
    puVar5 = puVar5 + 0x49;
    sighash = sighash + 1;
    bytes = bytes + 0x40;
    sVar8 = sVar8 - 1;
  } while (sVar8 != 0);
  lVar4 = 1;
  if ((0x4b < script_len) && (lVar4 = 2, 0xff < script_len)) {
    lVar4 = (ulong)(0xffff < script_len) * 2 + 3;
  }
  uVar3 = lVar7 + script_len + lVar4 + 1;
  if (uVar3 <= len) {
    *bytes_out = '\0';
    sVar8 = len - 1;
    bytes_out_00 = bytes_out + 1;
    puVar6 = local_4f8;
    puVar5 = local_478;
    local_508 = sighash_len;
    do {
      iVar2 = wally_script_push_from_bytes(puVar5,*puVar6,0,bytes_out_00,sVar8,puVar6);
      if (iVar2 != 0) goto LAB_0010cd68;
      bytes_out_00 = bytes_out_00 + *puVar6;
      sVar8 = sVar8 - *puVar6;
      puVar6 = puVar6 + 1;
      puVar5 = puVar5 + 0x49;
      local_508 = local_508 - 1;
    } while (local_508 != 0);
    iVar2 = wally_script_push_from_bytes(script,script_len,0,bytes_out_00,sVar8,local_4f8);
    if (iVar2 != 0) goto LAB_0010cd68;
    if (sVar8 < local_4f8[0]) {
      return -1;
    }
  }
  *written = uVar3;
  iVar2 = 0;
LAB_0010cd68:
  wally_clear(local_478,0x447);
  return iVar2;
}

Assistant:

int wally_scriptsig_multisig_from_bytes(
    const unsigned char *script, size_t script_len,
    const unsigned char *bytes, size_t bytes_len,
    const uint32_t *sighash, size_t sighash_len, uint32_t flags,
    unsigned char *bytes_out, size_t len, size_t *written)
{
#define MAX_DER (EC_SIGNATURE_DER_MAX_LEN + 1)
    unsigned char der_buff[15 * MAX_DER], *p = bytes_out;
    size_t der_len[15];
    size_t i, required = 0, n_sigs = bytes_len / EC_SIGNATURE_LEN;
    int ret = WALLY_OK;

    if (written)
        *written = 0;

    if (!script || !script_len || !bytes || !bytes_len || bytes_len % EC_SIGNATURE_LEN ||
        n_sigs < 1 || n_sigs > 15 || !sighash || sighash_len != n_sigs ||
        flags || !bytes_out || !written)
        return WALLY_EINVAL;

    /* Create and store the DER encoded signatures with lengths */
    for (i = 0; i < n_sigs; ++i) {
        if (sighash[i] & ~0xff) {
            ret = WALLY_EINVAL;
            goto cleanup;
        }
        ret = wally_ec_sig_to_der(bytes + i * EC_SIGNATURE_LEN, EC_SIGNATURE_LEN,
                                  &der_buff[i * MAX_DER], MAX_DER, &der_len[i]);
        if (ret != WALLY_OK)
            goto cleanup;
        der_buff[i * MAX_DER + der_len[i]] = sighash[i] & 0xff;
        ++der_len[i];
        required += script_get_push_size(der_len[i]);
    }

    /* Account for the initial OP_0 and final script push */
    required += 1 + script_get_push_size(script_len);

    if (len < required) {
        *written = required;
        goto cleanup;
    }

    *p++ = OP_0;
    len--;
    for (i = 0; i < n_sigs; ++i) {
        ret = wally_script_push_from_bytes(&der_buff[i * MAX_DER], der_len[i],
                                           0, p, len, &der_len[i]);
        if (ret != WALLY_OK)
            goto cleanup;
        p += der_len[i];
        len -= der_len[i];
    }
    ret = wally_script_push_from_bytes(script, script_len,
                                       0, p, len, &der_len[0]);
    if (ret != WALLY_OK)
        goto cleanup;
    if (len < der_len[0])
        return WALLY_ERROR; /* Required length mismatch, should not happen! */
    *written = required;

cleanup:
    wally_clear(der_buff, sizeof(der_buff));
    return ret;
}